

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_panel.cxx
# Opt level: O2

void template_clear(void)

{
  void *__ptr;
  int i;
  int line;
  
  line = 1;
  while( true ) {
    if (template_browser->lines < line) break;
    __ptr = Fl_Browser::data(template_browser,line);
    free(__ptr);
    line = line + 1;
  }
  Fl_Browser_::deselect(&template_browser->super_Fl_Browser_,0);
  Fl_Browser::clear(template_browser);
  return;
}

Assistant:

void template_clear() {
  int i;
  void *filename;
  
  for (i = 1; i <= template_browser->size(); i ++) {
    if ((filename = template_browser->data(i)) != NULL) free(filename);
  }
  
  template_browser->deselect();
  template_browser->clear();
}